

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

void __thiscall QResourcePrivate::ensureInitialized(QResourcePrivate *this)

{
  QString *this_00;
  QArrayData *data;
  QStringView *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  CutResult CVar4;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QStringView lhs;
  QStringBuilder<char16_t,_const_QString_&> local_88;
  QString local_78;
  QString local_58;
  QStringView local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->related).d.size == 0) &&
     (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i)) {
    if (((this->fileName).d.size == 1) &&
       (rhs.m_data = ":", rhs.m_size = 1, lhs.m_data = (this->fileName).d.ptr, lhs.m_size = 1,
       bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)) {
      QString::append(&this->fileName,(QChar)0x2f);
    }
    this_00 = &this->absoluteFilePath;
    QString::operator=(this_00,&this->fileName);
    bVar3 = QString::startsWith(this_00,(QChar)0x3a,CaseSensitive);
    if (!bVar3) {
      QString::insert(this_00,0,(QChar)0x3a);
    }
    local_38.m_data = (this->fileName).d.ptr;
    local_38.m_size = (this->fileName).d.size;
    if (((QArrayData *)local_38.m_size != (QArrayData *)0x0) &&
       (((QChar *)local_38.m_data)->ucs == L':')) {
      local_58.d.d = (Data *)0x1;
      local_78.d.d = (Data *)0xffffffffffffffff;
      CVar4 = QtPrivate::QContainerImplHelper::mid
                        (local_38.m_size,(qsizetype *)&local_58,(qsizetype *)&local_78);
      if (CVar4 == Null) {
        local_38.m_size = 0;
        local_38.m_data = (storage_type_conflict *)0x0;
      }
      else {
        local_38.m_data = local_38.m_data + (long)local_58.d.d;
        local_38.m_size = (qsizetype)local_78.d.d;
      }
    }
    if (((QArrayData *)local_38.m_size == (QArrayData *)0x0) || (*local_38.m_data != L'/')) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr._0_4_ = 0xaaaaaaaa;
      local_58.d.ptr._4_4_ = 0xaaaaaaaa;
      local_78.d.d = (Data *)CONCAT62(local_78.d.d._2_6_,0x2f);
      local_78.d.ptr = (char16_t *)&local_38;
      QStringBuilder<char16_t,_QStringView_&>::convertTo<QString>
                (&local_58,(QStringBuilder<char16_t,_QStringView_&> *)&local_78);
      bVar3 = load(this,&local_58);
      if (bVar3) {
        local_88.a = L':';
        local_88.b = &local_58;
        QStringBuilder<char16_t,_const_QString_&>::convertTo<QString>(&local_78,&local_88);
        data = &((this->absoluteFilePath).d.d)->super_QArrayData;
        pQVar1 = (QStringView *)(this->absoluteFilePath).d.ptr;
        (this->absoluteFilePath).d.d = local_78.d.d;
        (this->absoluteFilePath).d.ptr = local_78.d.ptr;
        qVar2 = (this->absoluteFilePath).d.size;
        (this->absoluteFilePath).d.size = local_78.d.size;
        local_78.d.d = (Data *)data;
        local_78.d.ptr = (char16_t *)pQVar1;
        local_78.d.size = qVar2;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
    }
    else {
      QString::QString(&local_58,(QChar *)local_38.m_data,local_38.m_size);
      load(this,&local_58);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QResourcePrivate::ensureInitialized() const
{
    if (!related.isEmpty())
        return;
    if (resourceGlobalData.isDestroyed())
        return;
    QResourcePrivate *that = const_cast<QResourcePrivate *>(this);
    if (fileName == ":"_L1)
        that->fileName += u'/';
    that->absoluteFilePath = fileName;
    if (!that->absoluteFilePath.startsWith(u':'))
        that->absoluteFilePath.prepend(u':');

    QStringView path(fileName);
    if (path.startsWith(u':'))
        path = path.mid(1);

    if (path.startsWith(u'/')) {
        that->load(path.toString());
    } else {
        // Should we search QDir::searchPath() before falling back to root ?
        const QString searchPath(u'/' + path);
        if (that->load(searchPath))
            that->absoluteFilePath = u':' + searchPath;
    }
}